

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

void amqpvalue_destroy(AMQP_VALUE value)

{
  uint32_t uVar1;
  AMQP_VALUE_DATA *value_data;
  AMQP_VALUE value_local;
  
  if ((value != (AMQP_VALUE)0x0) &&
     (uVar1 = value[-1].value.binary_value.length - 1, value[-1].value.binary_value.length = uVar1,
     uVar1 == 0)) {
    amqpvalue_clear(value);
    REFCOUNT_AMQP_VALUE_DATA_Destroy(value);
  }
  return;
}

Assistant:

void amqpvalue_destroy(AMQP_VALUE value)
{
    /* Codes_SRS_AMQPVALUE_01_315: [If the value argument is NULL, amqpvalue_destroy shall do nothing.] */
    if (value != NULL)
    {
        if (DEC_REF(AMQP_VALUE_DATA, value) == DEC_RETURN_ZERO)
        {
            /* Codes_SRS_AMQPVALUE_01_314: [amqpvalue_destroy shall free all resources allocated by any of the amqpvalue_create_xxx functions or amqpvalue_clone.] */
            AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
            amqpvalue_clear(value_data);
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, value);
        }
    }
}